

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

int google::protobuf::internal::WireFormat::MessageSetItemByteSize
              (FieldDescriptor *field,Message *message)

{
  int iVar1;
  int iVar2;
  uint value;
  int iVar3;
  undefined4 extraout_var;
  long *plVar4;
  
  iVar1 = (*(message->super_MessageLite)._vptr_MessageLite[0x12])(message);
  iVar3 = 1;
  iVar2 = 1;
  if (0x7f < *(uint *)(field + 0x28)) {
    iVar2 = io::CodedOutputStream::VarintSize32Fallback(*(uint *)(field + 0x28));
  }
  plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xb0))
                             ((long *)CONCAT44(extraout_var,iVar1),message,field,0);
  value = (**(code **)(*plVar4 + 0x48))(plVar4);
  if (0x7f < value) {
    iVar3 = io::CodedOutputStream::VarintSize32Fallback(value);
  }
  return iVar2 + 4 + iVar3 + value;
}

Assistant:

int WireFormat::MessageSetItemByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  int our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(field->number());

  // message
  const Message& sub_message = message_reflection->GetMessage(message, field);
  int message_size = sub_message.ByteSize();

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}